

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780Analyzer.cpp
# Opt level: O2

void __thiscall HD44780Analyzer::HD44780Analyzer(HD44780Analyzer *this)

{
  HD44780AnalyzerSettings *this_00;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__HD44780Analyzer_0010dca0;
  this_00 = (HD44780AnalyzerSettings *)operator_new(0x1b8);
  HD44780AnalyzerSettings::HD44780AnalyzerSettings(this_00);
  (this->mSettings)._M_ptr = this_00;
  (this->mResults)._M_ptr = (HD44780AnalyzerResults *)0x0;
  HD44780SimulationDataGenerator::HD44780SimulationDataGenerator(&this->mSimulationDataGenerator);
  this->mSimulationInitilized = false;
  this->mLastEStart = 0;
  this->mWaitBusy = 0;
  this->bitmode8 = true;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

HD44780Analyzer::HD44780Analyzer()
    : Analyzer2(),
      mSettings( new HD44780AnalyzerSettings() ),
      mSimulationInitilized( false ),
      bitmode8( true ),
      mLastEStart( 0 ),
      mWaitBusy( 0 )
{
    SetAnalyzerSettings( mSettings.get() );
}